

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hlslParseHelper.cpp
# Opt level: O2

int __thiscall
glslang::HlslParseContext::findSubtreeOffset(HlslParseContext *this,TIntermNode *node)

{
  long lVar1;
  char cVar2;
  int iVar3;
  undefined4 extraout_var;
  const_iterator cVar5;
  TType *type;
  key_type_conflict2 local_30;
  long *plVar4;
  
  iVar3 = (*node->_vptr_TIntermNode[0x18])(node);
  plVar4 = (long *)CONCAT44(extraout_var,iVar3);
  iVar3 = 0;
  if (plVar4 != (long *)0x0) {
    cVar2 = (**(code **)(*plVar4 + 0x150))(plVar4);
    if ((cVar2 == '\0') && (cVar2 = (**(code **)(*plVar4 + 0x168))(plVar4), cVar2 == '\0')) {
      return 0;
    }
    lVar1 = plVar4[0x18];
    iVar3 = 0;
    if ((int)lVar1 != -1) {
      local_30 = (**(code **)(*plVar4 + 0x180))(plVar4);
      cVar5 = std::
              _Rb_tree<long_long,_std::pair<const_long_long,_glslang::HlslParseContext::TFlattenData>,_std::_Select1st<std::pair<const_long_long,_glslang::HlslParseContext::TFlattenData>_>,_std::less<long_long>,_glslang::pool_allocator<std::pair<const_long_long,_glslang::HlslParseContext::TFlattenData>_>_>
              ::find((_Rb_tree<long_long,_std::pair<const_long_long,_glslang::HlslParseContext::TFlattenData>,_std::_Select1st<std::pair<const_long_long,_glslang::HlslParseContext::TFlattenData>_>,_std::less<long_long>,_glslang::pool_allocator<std::pair<const_long_long,_glslang::HlslParseContext::TFlattenData>_>_>
                      *)&this->flattenMap,&local_30);
      if ((_Rb_tree_header *)cVar5._M_node !=
          &(this->flattenMap).
           super_map<long_long,_glslang::HlslParseContext::TFlattenData,_std::less<long_long>,_glslang::pool_allocator<std::pair<const_long_long,_glslang::HlslParseContext::TFlattenData>_>_>
           ._M_t._M_impl.super__Rb_tree_header) {
        type = (TType *)(**(code **)(*plVar4 + 0xf0))(plVar4);
        iVar3 = findSubtreeOffset(this,type,(int)lVar1,(TVector<int> *)&cVar5._M_node[2]._M_parent);
      }
    }
  }
  return iVar3;
}

Assistant:

int HlslParseContext::findSubtreeOffset(const TIntermNode& node) const
{
    const TIntermSymbol* sym = node.getAsSymbolNode();
    if (sym == nullptr)
        return 0;
    if (!sym->isArray() && !sym->isStruct())
        return 0;
    int subset = sym->getFlattenSubset();
    if (subset == -1)
        return 0;

    // Getting this far means a partial aggregate is identified by the flatten subset.
    // Find the first leaf of the subset.

    const auto flattenData = flattenMap.find(sym->getId());
    if (flattenData == flattenMap.end())
        return 0;

    return findSubtreeOffset(sym->getType(), subset, flattenData->second.offsets);

    do {
        subset = flattenData->second.offsets[subset];
    } while (true);
}